

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_normalize_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  mbedtls_mpi *X;
  int iVar1;
  int iVar2;
  mbedtls_mpi *X_00;
  mbedtls_mpi ZZi;
  mbedtls_mpi Zi;
  mbedtls_mpi local_50;
  mbedtls_mpi local_38;
  
  X = &pt->Z;
  iVar2 = 0;
  iVar1 = mbedtls_mpi_cmp_int(X,0);
  if (iVar1 != 0) {
    mbedtls_mpi_init(&local_38);
    mbedtls_mpi_init(&local_50);
    iVar2 = mbedtls_mpi_inv_mod(&local_38,X,&grp->P);
    if (iVar2 == 0) {
      iVar2 = mbedtls_mpi_mul_mpi(&local_50,&local_38,&local_38);
      if (iVar2 == 0) {
        iVar2 = ecp_modp(&local_50,grp);
        if (iVar2 == 0) {
          mul_count = mul_count + 1;
          iVar2 = mbedtls_mpi_mul_mpi(&pt->X,&pt->X,&local_50);
          if (iVar2 == 0) {
            iVar2 = ecp_modp(&pt->X,grp);
            if (iVar2 == 0) {
              mul_count = mul_count + 1;
              X_00 = &pt->Y;
              iVar2 = mbedtls_mpi_mul_mpi(X_00,X_00,&local_50);
              if (iVar2 == 0) {
                iVar2 = ecp_modp(X_00,grp);
                if (iVar2 == 0) {
                  mul_count = mul_count + 1;
                  iVar2 = mbedtls_mpi_mul_mpi(X_00,X_00,&local_38);
                  if (iVar2 == 0) {
                    iVar2 = ecp_modp(X_00,grp);
                    if (iVar2 == 0) {
                      mul_count = mul_count + 1;
                      iVar2 = mbedtls_mpi_lset(X,1);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    mbedtls_mpi_free(&local_38);
    mbedtls_mpi_free(&local_50);
  }
  return iVar2;
}

Assistant:

static int ecp_normalize_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt )
{
    int ret;
    mbedtls_mpi Zi, ZZi;

    if( mbedtls_mpi_cmp_int( &pt->Z, 0 ) == 0 )
        return( 0 );

    mbedtls_mpi_init( &Zi ); mbedtls_mpi_init( &ZZi );

    /*
     * X = X / Z^2  mod p
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &Zi,      &pt->Z,     &grp->P ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ZZi,     &Zi,        &Zi     ) ); MOD_MUL( ZZi );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &pt->X,   &pt->X,     &ZZi    ) ); MOD_MUL( pt->X );

    /*
     * Y = Y / Z^3  mod p
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &pt->Y,   &pt->Y,     &ZZi    ) ); MOD_MUL( pt->Y );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &pt->Y,   &pt->Y,     &Zi     ) ); MOD_MUL( pt->Y );

    /*
     * Z = 1
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Z, 1 ) );

cleanup:

    mbedtls_mpi_free( &Zi ); mbedtls_mpi_free( &ZZi );

    return( ret );
}